

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O1

bool __thiscall
Diligent::ShaderGLImpl::GetCompileStatus
          (ShaderGLImpl *this,IDataBlob **ppCompilerOutput,bool ThrowOnError)

{
  ostream *poVar1;
  GLint GVar2;
  void *__dest;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  char *pcVar4;
  char (*in_R8) [35];
  GLint compiled;
  int InfoLogLen;
  vector<char,_std::allocator<char>_> InfoLog;
  int CharsWritten;
  string msg;
  GLint local_21c;
  string local_218;
  vector<char,_std::allocator<char>_> local_1f8;
  GLsizei local_1d8;
  undefined4 uStack_1d4;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_21c = 0;
  (*__glewGetShaderiv)((this->m_GLShaderObj).m_uiHandle,0x8b81,&local_21c);
  local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (GLchar *)0x0;
  local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (GLchar *)0x0;
  local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218._M_dataplus._M_p._0_4_ = 0;
  (*__glewGetShaderiv)((this->m_GLShaderObj).m_uiHandle,0x8b84,(GLint *)&local_218);
  if (0 < (long)(int)local_218._M_dataplus._M_p) {
    std::vector<char,_std::allocator<char>_>::resize
              (&local_1f8,(long)(int)local_218._M_dataplus._M_p);
    local_1d8 = 0;
    (*__glewGetShaderInfoLog)
              ((this->m_GLShaderObj).m_uiHandle,(int)local_218._M_dataplus._M_p,&local_1d8,
               local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_1d8 != (int)local_218._M_dataplus._M_p + -1) {
      FormatString<char[27]>((string *)local_1b8,(char (*) [27])"Unexpected info log length");
      DebugAssertionFailed
                ((Char *)local_1b8._0_8_,"GetCompileStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x13d);
      if ((DataBlobImpl *)local_1b8._0_8_ != (DataBlobImpl *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
    if (ppCompilerOutput != (IDataBlob **)0x0) {
      DataBlobImpl::Create
                ((DataBlobImpl *)local_1b8,
                 (long)(int)local_218._M_dataplus._M_p + (this->m_GLSLSourceString)._M_string_length
                 + 1,(void *)0x0);
      __dest = DataBlobImpl::GetDataPtr((DataBlobImpl *)local_1b8._0_8_,0);
      if (local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        memcpy(__dest,local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(long)(int)local_218._M_dataplus._M_p);
      }
      memcpy((void *)((long)__dest + (long)(int)local_218._M_dataplus._M_p),
             (this->m_GLSLSourceString)._M_dataplus._M_p,
             (this->m_GLSLSourceString)._M_string_length + 1);
      DataBlobImpl::QueryInterface
                ((DataBlobImpl *)local_1b8._0_8_,(INTERFACE_ID *)IID_DataBlob,
                 (IObject **)ppCompilerOutput);
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_1b8);
    }
  }
  if ((local_21c == 0) ||
     (local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar1 = (ostream *)(local_1b8 + 0x10);
    pcVar4 = "Compiler output for shader \'";
    if (local_21c == 0) {
      pcVar4 = "Failed to compile shader \'";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,pcVar4,(ulong)(local_21c != 0) * 2 + 0x1a);
    pcVar4 = (this->super_ShaderBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
             .m_Desc.super_DeviceObjectAttribs.Name;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18))
      ;
    }
    else {
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    if (local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      if (local_21c == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1," (no shader log available).",0x1b);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                      (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::ostream::write((char *)poVar1,
                          (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
    }
    if (local_21c == 0) {
      if (ppCompilerOutput == (IDataBlob **)0x0) {
        FormatString<char[62],std::__cxx11::string,char[35]>
                  (&local_218,
                   (Diligent *)"Failed shader full source: \n\n>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",
                   (char (*) [62])&this->m_GLSLSourceString,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\n<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<\n\n",in_R8);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (0,CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p),0,
                     0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p) !=
            &local_218.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p)
                          ,local_218.field_2._M_allocated_capacity + 1);
        }
      }
      if (ThrowOnError) {
        std::__cxx11::stringbuf::str();
        LogError<true,std::__cxx11::string>
                  (false,"GetCompileStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                   ,0x171,&local_218);
      }
      else {
        std::__cxx11::stringbuf::str();
        FormatString<std::__cxx11::string>(&local_218,(Diligent *)&local_1d8,Args_00);
        if ((long *)CONCAT44(uStack_1d4,local_1d8) != local_1c8) {
          operator_delete((long *)CONCAT44(uStack_1d4,local_1d8),local_1c8[0] + 1);
        }
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (2,CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p),0,
                     0,0);
        }
      }
    }
    else {
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&local_218,(Diligent *)&local_1d8,Args);
      if ((long *)CONCAT44(uStack_1d4,local_1d8) != local_1c8) {
        operator_delete((long *)CONCAT44(uStack_1d4,local_1d8),local_1c8[0] + 1);
      }
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)
                  (0,CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p),0,0,
                   0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p) !=
        &local_218.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_218._M_dataplus._M_p._4_4_,(int)local_218._M_dataplus._M_p),
                      local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  GVar2 = local_21c;
  if (local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLchar *)0x0) {
    operator_delete(local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return GVar2 != 0;
}

Assistant:

bool ShaderGLImpl::GetCompileStatus(IDataBlob** ppCompilerOutput, bool ThrowOnError) noexcept(false)
{
    GLint compiled = GL_FALSE;
    // Get compilation status
    glGetShaderiv(m_GLShaderObj, GL_COMPILE_STATUS, &compiled);

    std::vector<GLchar> InfoLog;
    {
        int InfoLogLen = 0;
        // The function glGetShaderiv() tells how many bytes to allocate; the length includes the NULL terminator.
        glGetShaderiv(m_GLShaderObj, GL_INFO_LOG_LENGTH, &InfoLogLen);

        if (InfoLogLen > 0)
        {
            InfoLog.resize(InfoLogLen);

            int CharsWritten = 0;
            // Get the log. InfoLogLen is the size of InfoLog. This tells OpenGL how many bytes at maximum it will write
            // charsWritten is a return value, specifying how many bytes it actually wrote. One may pass NULL if he
            // doesn't care
            glGetShaderInfoLog(m_GLShaderObj, InfoLogLen, &CharsWritten, InfoLog.data());
            VERIFY(CharsWritten == InfoLogLen - 1, "Unexpected info log length");

            if (ppCompilerOutput != nullptr)
            {
                // InfoLogLen accounts for null terminator
                auto pOutputDataBlob = DataBlobImpl::Create(InfoLogLen + m_GLSLSourceString.length() + 1);

                char* DataPtr = pOutputDataBlob->GetDataPtr<char>();
                if (!InfoLog.empty())
                {
                    // Copy info log including null terminator
                    memcpy(DataPtr, InfoLog.data(), InfoLogLen);
                }
                // Copy source code including null terminator
                memcpy(DataPtr + InfoLogLen, m_GLSLSourceString.data(), m_GLSLSourceString.length() + 1);

                pOutputDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppCompilerOutput));
            }
        }
    }

    if (!compiled || !InfoLog.empty())
    {
        std::stringstream ss;
        ss << (compiled ? "Compiler output for shader '" : "Failed to compile shader '") << m_Desc.Name << "'";

        if (!InfoLog.empty())
        {
            ss << ":" << std::endl;
            ss.write(InfoLog.data(), InfoLog.size() - 1);
        }
        else if (!compiled)
        {
            ss << " (no shader log available).";
        }

        if (compiled)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            if (ppCompilerOutput == nullptr)
            {
                // Dump full source code to debug output
                LOG_INFO_MESSAGE("Failed shader full source: \n\n>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",
                                 m_GLSLSourceString,
                                 "\n<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<\n\n");
            }

            if (ThrowOnError)
            {
                LOG_ERROR_AND_THROW(ss.str());
            }
            else
            {
                LOG_ERROR_MESSAGE(ss.str());
            }
        }
    }

    return compiled != GL_FALSE;
}